

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.cc
# Opt level: O2

bool __thiscall
draco::MeshAttributeCornerTable::RecomputeVerticesInternal<true>
          (MeshAttributeCornerTable *this,Mesh *mesh,PointAttribute *att)

{
  uint uVar1;
  pointer pIVar2;
  pointer pIVar3;
  const_reference cVar4;
  uint uVar5;
  value_type corner;
  CornerTable *this_00;
  ulong uVar6;
  uint uVar7;
  reference rVar8;
  CornerIndex first_c;
  value_type local_64;
  size_type local_60;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_54;
  Mesh *local_50;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *local_48;
  vector<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
  *local_40;
  vector<bool,_std::allocator<bool>_> *local_38;
  
  pIVar2 = (this->vertex_to_attribute_entry_id_map_).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->vertex_to_attribute_entry_id_map_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar2) {
    (this->vertex_to_attribute_entry_id_map_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar2;
  }
  pIVar3 = (this->vertex_to_left_most_corner_map_).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->vertex_to_left_most_corner_map_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar3) {
    (this->vertex_to_left_most_corner_map_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar3;
  }
  local_40 = (vector<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
              *)&this->vertex_to_attribute_entry_id_map_;
  local_48 = &this->vertex_to_left_most_corner_map_;
  local_38 = &this->is_vertex_on_seam_;
  local_60 = 0;
  uVar5 = 0;
  local_50 = mesh;
  while( true ) {
    pIVar3 = (this->corner_table_->vertex_corners_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (ulong)((long)(this->corner_table_->vertex_corners_).vector_.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar3) >> 2 &
            0xffffffff;
    if (uVar6 <= local_60) break;
    uVar1 = pIVar3[local_60].value_;
    uVar7 = uVar5;
    if (uVar1 != 0xffffffff) {
      first_c.value_ = 0xffffffff;
      if (-1 < (int)uVar1) {
        first_c.value_ =
             (local_50->faces_).vector_.
             super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar1 / 3]._M_elems[(ulong)uVar1 % 3].
             value_;
      }
      if (att->identity_mapping_ == false) {
        first_c.value_ =
             (att->indices_map_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[first_c.value_].value_;
      }
      std::
      vector<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
      ::emplace_back<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>
                (local_40,(IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)&first_c)
      ;
      local_64.value_ = 0;
      first_c.value_ = uVar1;
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](local_38,local_60);
      if ((*rVar8._M_p & rVar8._M_mask) != 0) {
        local_64.value_ = (uint)SwingLeft(this,first_c);
        while (local_64.value_ != 0xffffffff) {
          first_c.value_ = local_64.value_;
          local_64.value_ = (uint)SwingLeft(this,local_64.value_);
          if (local_64.value_ == uVar1) goto LAB_0012c630;
        }
      }
      uVar7 = uVar5 + 1;
      (this->corner_to_vertex_map_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[first_c.value_].value_ = uVar5;
      std::
      vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ::push_back(local_48,&first_c);
      this_00 = this->corner_table_;
      corner.value_ = first_c.value_;
      while ((local_64.value_ = (uint)CornerTable::SwingRight(this_00,corner.value_),
             local_64.value_ != 0xffffffff && (local_64.value_ != first_c.value_))) {
        uVar1 = local_64.value_ - 2;
        if ((local_64.value_ + 1) % 3 != 0) {
          uVar1 = local_64.value_ + 1;
        }
        cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (&this->is_edge_on_seam_,(ulong)uVar1);
        uVar1 = uVar7;
        if (cVar4) {
          local_54.value_ = 0xffffffff;
          if (-1 < (int)local_64.value_) {
            local_54.value_ =
                 (local_50->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(ulong)local_64.value_ / 3]._M_elems
                 [(ulong)local_64.value_ % 3].value_;
          }
          if (att->identity_mapping_ == false) {
            local_54.value_ =
                 (att->indices_map_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_54.value_].value_;
          }
          std::
          vector<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
          ::emplace_back<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>
                    (local_40,&local_54);
          std::
          vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ::push_back(local_48,&local_64);
          uVar1 = uVar7 + 1;
          uVar5 = uVar7;
        }
        uVar7 = uVar1;
        (this->corner_to_vertex_map_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[local_64.value_].value_ = uVar5;
        this_00 = this->corner_table_;
        corner.value_ = local_64.value_;
      }
    }
    local_60 = local_60 + 1;
    uVar5 = uVar7;
  }
LAB_0012c630:
  return uVar6 <= local_60;
}

Assistant:

bool MeshAttributeCornerTable::RecomputeVerticesInternal(
    const Mesh *mesh, const PointAttribute *att) {
  DRACO_DCHECK(GetValenceCache().IsCacheEmpty());
  vertex_to_attribute_entry_id_map_.clear();
  vertex_to_left_most_corner_map_.clear();
  int num_new_vertices = 0;
  for (VertexIndex v(0); v < corner_table_->num_vertices(); ++v) {
    const CornerIndex c = corner_table_->LeftMostCorner(v);
    if (c == kInvalidCornerIndex) {
      continue;  // Isolated vertex?
    }
    AttributeValueIndex first_vert_id(num_new_vertices++);
    if (init_vertex_to_attribute_entry_map) {
      const PointIndex point_id = mesh->CornerToPointId(c.value());
      vertex_to_attribute_entry_id_map_.push_back(att->mapped_index(point_id));
    } else {
      // Identity mapping
      vertex_to_attribute_entry_id_map_.push_back(first_vert_id);
    }
    CornerIndex first_c = c;
    CornerIndex act_c;
    // Check if the vertex is on a seam edge, if it is we need to find the first
    // attribute entry on the seam edge when traversing in the CCW direction.
    if (is_vertex_on_seam_[v.value()]) {
      // Try to swing left on the modified corner table. We need to get the
      // first corner that defines an attribute seam.
      act_c = SwingLeft(first_c);
      while (act_c != kInvalidCornerIndex) {
        first_c = act_c;
        act_c = SwingLeft(act_c);
        if (act_c == c) {
          // We reached the initial corner which shouldn't happen when we swing
          // left from |c|.
          return false;
        }
      }
    }
    corner_to_vertex_map_[first_c.value()] = VertexIndex(first_vert_id.value());
    vertex_to_left_most_corner_map_.push_back(first_c);
    act_c = corner_table_->SwingRight(first_c);
    while (act_c != kInvalidCornerIndex && act_c != first_c) {
      if (IsCornerOppositeToSeamEdge(corner_table_->Next(act_c))) {
        first_vert_id = AttributeValueIndex(num_new_vertices++);
        if (init_vertex_to_attribute_entry_map) {
          const PointIndex point_id = mesh->CornerToPointId(act_c.value());
          vertex_to_attribute_entry_id_map_.push_back(
              att->mapped_index(point_id));
        } else {
          // Identity mapping.
          vertex_to_attribute_entry_id_map_.push_back(first_vert_id);
        }
        vertex_to_left_most_corner_map_.push_back(act_c);
      }
      corner_to_vertex_map_[act_c.value()] = VertexIndex(first_vert_id.value());
      act_c = corner_table_->SwingRight(act_c);
    }
  }
  return true;
}